

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Strided_put(int g_a,int *lo,int *hi,int *skip,void *buf,int *ld)

{
  long lVar1;
  long lVar2;
  Integer _ga_work [7];
  Integer _ga_skip [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long alStack_138 [2];
  Integer aIStack_128 [7];
  long lStack_f0;
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  alStack_138[1] = 0x109b57;
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_70)[lVar2] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_b0)[lVar2] = (long)*hi + 1;
      hi = hi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (1 < lVar1) {
    do {
      alStack_138[lVar2] = (long)*ld;
      lVar2 = lVar2 + -1;
      ld = ld + 1;
    } while (lVar2 != 1);
  }
  if (0 < lVar1) {
    do {
      (&lStack_f0)[lVar1] = (long)*skip;
      skip = skip + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  alStack_138[1] = 0x109bec;
  pnga_strided_put((long)g_a,local_68,local_a8,local_e8,buf,aIStack_128);
  return;
}

Assistant:

void NGA_Strided_put(int g_a, int lo[], int hi[], int skip[],
                     void* buf, int ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_skip[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    COPYC2F(skip, _ga_skip, ndim);
    wnga_strided_put(a, _ga_lo, _ga_hi, _ga_skip, buf, _ga_work);
}